

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpanel_bmod.c
# Opt level: O3

void dpanel_bmod(int m,int w,int jcol,int nseg,double *dense,double *tempv,int *segrep,int *repfnz,
                GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  uint ncol;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  flops_t *pfVar5;
  int *piVar6;
  int *piVar7;
  int_t *piVar8;
  int_t *piVar9;
  void *pvVar10;
  int_t *piVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  double *pdVar20;
  double *pdVar21;
  int *piVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  double *pdVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int nrow;
  long lVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  int local_16c;
  double *local_120;
  
  pfVar5 = stat->ops;
  piVar6 = Glu->xsup;
  piVar7 = Glu->supno;
  piVar8 = Glu->lsub;
  piVar9 = Glu->xlsub;
  pvVar10 = Glu->lusup;
  piVar11 = Glu->xlusup;
  iVar12 = sp_ienv(3);
  iVar13 = sp_ienv(7);
  iVar12 = sp_ienv((uint)(iVar12 <= iVar13) * 4 + 3);
  iVar13 = sp_ienv(4);
  iVar14 = sp_ienv(5);
  if (0 < nseg) {
    iVar15 = iVar13 + iVar12;
    iVar34 = jcol + w;
    uVar31 = (ulong)(uint)nseg;
    iVar23 = 0;
    do {
      iVar1 = segrep[uVar31 - 1];
      iVar2 = piVar6[piVar7[iVar1]];
      iVar32 = iVar1 - iVar2;
      iVar27 = iVar32 + 1;
      iVar3 = piVar9[iVar2];
      iVar16 = piVar9[(long)iVar2 + 1] - iVar3;
      nrow = iVar16 - iVar27;
      local_16c = iVar3 + iVar32 + 1;
      iVar17 = iVar3 + iVar32;
      if ((iVar27 < iVar14) || (nrow <= iVar13)) {
        if (0 < w) {
          lVar24 = (long)local_16c;
          piVar22 = repfnz;
          pdVar26 = dense;
          iVar19 = jcol;
          do {
            iVar28 = piVar22[iVar1];
            if (iVar28 != -1) {
              ncol = (iVar1 - iVar28) + 1;
              iVar29 = piVar11[iVar2];
              pfVar5[0x13] = (float)(int)((iVar1 - iVar28) * ncol) + pfVar5[0x13];
              pfVar5[0x14] = (float)(int)(nrow * 2 * ncol) + pfVar5[0x14];
              if (iVar1 == iVar28) {
                iVar28 = piVar9[(long)iVar2 + 1];
                if (local_16c < iVar28) {
                  dVar39 = pdVar26[piVar8[iVar17]];
                  pdVar21 = (double *)
                            ((long)pvVar10 + (long)(iVar29 + iVar32 * iVar16 + iVar27) * 8);
                  lVar25 = lVar24;
                  do {
                    pdVar26[piVar8[lVar25]] = *pdVar21 * -dVar39 + pdVar26[piVar8[lVar25]];
                    lVar25 = lVar25 + 1;
                    pdVar21 = pdVar21 + 1;
                  } while (lVar25 < iVar28);
                }
              }
              else if (iVar1 - iVar28 < 3) {
                iVar28 = piVar8[iVar17];
                iVar29 = iVar29 + (iVar16 + 1) * iVar32;
                iVar18 = piVar8[(long)iVar17 + -1];
                dVar39 = pdVar26[iVar18];
                lVar25 = (long)(iVar29 - iVar16);
                if (ncol == 2) {
                  dVar37 = pdVar26[iVar28] - *(double *)((long)pvVar10 + lVar25 * 8) * dVar39;
                  pdVar26[iVar28] = dVar37;
                  iVar28 = piVar9[(long)iVar2 + 1];
                  if (local_16c < iVar28) {
                    lVar30 = 0;
                    do {
                      pdVar26[piVar8[lVar24 + lVar30]] =
                           pdVar26[piVar8[lVar24 + lVar30]] -
                           (*(double *)((long)pvVar10 + lVar30 * 8 + (long)iVar29 * 8 + 8) * dVar37
                           + *(double *)((long)pvVar10 + lVar30 * 8 + lVar25 * 8 + 8) * dVar39);
                      lVar33 = lVar24 + lVar30;
                      lVar30 = lVar30 + 1;
                    } while (lVar33 + 1 < (long)iVar28);
                  }
                }
                else {
                  dVar37 = pdVar26[piVar8[(long)iVar17 + -2]];
                  lVar30 = (long)((iVar29 - iVar16) - iVar16);
                  dVar39 = dVar39 - *(double *)((long)pvVar10 + lVar30 * 8 + -8) * dVar37;
                  dVar38 = (pdVar26[iVar28] - *(double *)((long)pvVar10 + lVar25 * 8) * dVar39) -
                           *(double *)((long)pvVar10 + lVar30 * 8) * dVar37;
                  pdVar26[iVar28] = dVar38;
                  pdVar26[iVar18] = dVar39;
                  iVar28 = piVar9[(long)iVar2 + 1];
                  if (local_16c < iVar28) {
                    lVar30 = 0;
                    do {
                      pdVar26[piVar8[lVar24 + lVar30]] =
                           pdVar26[piVar8[lVar24 + lVar30]] -
                           (*(double *)
                             ((long)pvVar10 + lVar30 * 8 + lVar25 * 8 + (long)iVar16 * -8 + 8) *
                            dVar37 + *(double *)((long)pvVar10 + lVar30 * 8 + (long)iVar29 * 8 + 8)
                                     * dVar38 +
                                     *(double *)((long)pvVar10 + lVar30 * 8 + lVar25 * 8 + 8) *
                                     dVar39);
                      lVar33 = lVar24 + lVar30;
                      lVar30 = lVar30 + 1;
                    } while (lVar33 + 1 < (long)iVar28);
                  }
                }
              }
              else {
                uVar36 = (ulong)(uint)((iVar1 + 1) - iVar28);
                iVar18 = (iVar28 - iVar2) + iVar3;
                uVar35 = 0;
                do {
                  tempv[uVar35] = pdVar26[piVar8[(long)iVar18 + uVar35]];
                  uVar35 = uVar35 + 1;
                } while (uVar36 != uVar35);
                iVar29 = iVar29 + (iVar28 - iVar2) * (iVar16 + 1);
                dlsolve(iVar16,ncol,(double *)((long)pvVar10 + (long)iVar29 * 8),tempv);
                pdVar21 = tempv + ncol;
                dmatvec(iVar16,nrow,ncol,(double *)((long)pvVar10 + (long)(int)(iVar29 + ncol) * 8),
                        tempv,pdVar21);
                uVar35 = 0;
                iVar28 = iVar18;
                do {
                  pdVar26[piVar8[(long)iVar18 + uVar35]] = tempv[uVar35];
                  tempv[uVar35] = 0.0;
                  uVar35 = uVar35 + 1;
                  iVar28 = iVar28 + 1;
                } while (uVar36 != uVar35);
                if (0 < nrow) {
                  lVar25 = 0;
                  do {
                    pdVar26[piVar8[iVar28 + lVar25]] =
                         pdVar26[piVar8[iVar28 + lVar25]] - pdVar21[lVar25];
                    pdVar21[lVar25] = 0.0;
                    lVar25 = lVar25 + 1;
                  } while (lVar25 < nrow);
                }
              }
            }
            iVar19 = iVar19 + 1;
            piVar22 = piVar22 + m;
            pdVar26 = pdVar26 + m;
          } while (iVar19 < iVar34);
        }
      }
      else {
        if (0 < w) {
          lVar24 = (long)local_16c;
          pdVar21 = tempv;
          piVar22 = repfnz;
          pdVar26 = dense;
          iVar19 = jcol;
          do {
            iVar28 = piVar22[iVar1];
            if (iVar28 != -1) {
              iVar29 = (iVar1 - iVar28) + 1;
              iVar18 = piVar11[iVar2];
              pfVar5[0x13] = (float)((iVar1 - iVar28) * iVar29) + pfVar5[0x13];
              pfVar5[0x14] = (float)(nrow * 2 * iVar29) + pfVar5[0x14];
              if (iVar1 == iVar28) {
                iVar28 = piVar9[(long)iVar2 + 1];
                if (local_16c < iVar28) {
                  dVar39 = pdVar26[piVar8[iVar17]];
                  pdVar20 = (double *)
                            ((long)pvVar10 + (long)(iVar18 + iVar32 * iVar16 + iVar27) * 8);
                  lVar25 = lVar24;
                  do {
                    pdVar26[piVar8[lVar25]] = *pdVar20 * -dVar39 + pdVar26[piVar8[lVar25]];
                    lVar25 = lVar25 + 1;
                    pdVar20 = pdVar20 + 1;
                  } while (lVar25 < iVar28);
                }
              }
              else if (iVar1 - iVar28 < 3) {
                iVar28 = piVar8[iVar17];
                iVar4 = piVar8[(long)iVar17 + -1];
                dVar39 = pdVar26[iVar4];
                iVar18 = iVar18 + (iVar16 + 1) * iVar32;
                lVar25 = (long)(iVar18 - iVar16);
                if (iVar29 == 2) {
                  dVar37 = pdVar26[iVar28] - *(double *)((long)pvVar10 + lVar25 * 8) * dVar39;
                  pdVar26[iVar28] = dVar37;
                  iVar28 = piVar9[(long)iVar2 + 1];
                  if (local_16c < iVar28) {
                    lVar30 = 0;
                    do {
                      pdVar26[piVar8[lVar24 + lVar30]] =
                           pdVar26[piVar8[lVar24 + lVar30]] -
                           (*(double *)((long)pvVar10 + lVar30 * 8 + (long)iVar18 * 8 + 8) * dVar37
                           + *(double *)((long)pvVar10 + lVar30 * 8 + lVar25 * 8 + 8) * dVar39);
                      lVar33 = lVar30 + lVar24;
                      lVar30 = lVar30 + 1;
                    } while (lVar33 + 1 < (long)iVar28);
                  }
                }
                else {
                  dVar37 = pdVar26[piVar8[(long)iVar17 + -2]];
                  lVar30 = (long)((iVar18 - iVar16) - iVar16);
                  dVar39 = dVar39 - *(double *)((long)pvVar10 + lVar30 * 8 + -8) * dVar37;
                  dVar38 = (pdVar26[iVar28] - *(double *)((long)pvVar10 + lVar25 * 8) * dVar39) -
                           *(double *)((long)pvVar10 + lVar30 * 8) * dVar37;
                  pdVar26[iVar28] = dVar38;
                  pdVar26[iVar4] = dVar39;
                  iVar28 = piVar9[(long)iVar2 + 1];
                  if (local_16c < iVar28) {
                    lVar30 = 0;
                    do {
                      pdVar26[piVar8[lVar24 + lVar30]] =
                           pdVar26[piVar8[lVar24 + lVar30]] -
                           (*(double *)
                             ((long)pvVar10 + lVar30 * 8 + lVar25 * 8 + (long)iVar16 * -8 + 8) *
                            dVar37 + *(double *)((long)pvVar10 + lVar30 * 8 + (long)iVar18 * 8 + 8)
                                     * dVar38 +
                                     *(double *)((long)pvVar10 + lVar30 * 8 + lVar25 * 8 + 8) *
                                     dVar39);
                      lVar33 = lVar30 + lVar24;
                      lVar30 = lVar30 + 1;
                    } while (lVar33 + 1 < (long)iVar28);
                  }
                }
              }
              else {
                uVar35 = 0;
                do {
                  pdVar21[uVar35] = pdVar26[piVar8[(long)(iVar3 + (iVar28 - iVar2)) + uVar35]];
                  uVar35 = uVar35 + 1;
                } while ((uint)((iVar1 + 1) - iVar28) != uVar35);
                dlsolve(iVar16,iVar29,
                        (double *)
                        ((long)pvVar10 + (long)(iVar18 + (iVar28 - iVar2) * (iVar16 + 1)) * 8),
                        pdVar21);
              }
            }
            iVar19 = iVar19 + 1;
            piVar22 = piVar22 + m;
            pdVar26 = pdVar26 + m;
            pdVar21 = pdVar21 + iVar15;
          } while (iVar19 < iVar34);
        }
        if (0 < nrow) {
          iVar17 = 0;
          do {
            iVar19 = iVar17 + iVar13;
            iVar32 = iVar19;
            if (nrow < iVar19) {
              iVar32 = nrow;
            }
            iVar28 = iVar32 - iVar17;
            if (iVar13 < iVar32 - iVar17) {
              iVar28 = iVar13;
            }
            if (0 < w) {
              iVar32 = piVar11[iVar2];
              piVar22 = repfnz;
              pdVar26 = dense;
              pdVar21 = tempv + iVar12;
              local_120 = tempv;
              iVar29 = jcol;
              do {
                iVar18 = piVar22[iVar1];
                if (((iVar18 != -1) && (2 < iVar1 - iVar18)) &&
                   (dmatvec(iVar16,iVar28,(iVar1 - iVar18) + 1,
                            (double *)
                            ((long)pvVar10 +
                            (long)((iVar18 - iVar2) * iVar16 + iVar17 + iVar27 + iVar32) * 8),
                            local_120,local_120 + iVar12), 0 < iVar28)) {
                  lVar24 = 0;
                  do {
                    pdVar26[piVar8[local_16c + lVar24]] =
                         pdVar26[piVar8[local_16c + lVar24]] - pdVar21[lVar24];
                    pdVar21[lVar24] = 0.0;
                    lVar24 = lVar24 + 1;
                  } while (lVar24 < iVar28);
                }
                iVar29 = iVar29 + 1;
                piVar22 = piVar22 + m;
                pdVar26 = pdVar26 + m;
                local_120 = local_120 + iVar15;
                pdVar21 = pdVar21 + iVar15;
              } while (iVar29 < iVar34);
            }
            local_16c = local_16c + iVar13;
            iVar17 = iVar19;
          } while (iVar19 < nrow);
        }
        if (0 < w) {
          pdVar21 = tempv;
          pdVar26 = dense;
          piVar22 = repfnz;
          iVar16 = jcol;
          do {
            iVar17 = piVar22[iVar1];
            if ((iVar17 != -1) && (2 < iVar1 - iVar17)) {
              uVar35 = 0;
              do {
                pdVar26[piVar8[(long)((iVar3 - iVar2) + iVar17) + uVar35]] = pdVar21[uVar35];
                pdVar21[uVar35] = 0.0;
                uVar35 = uVar35 + 1;
              } while ((uint)((iVar1 + 1) - iVar17) != uVar35);
            }
            iVar16 = iVar16 + 1;
            piVar22 = piVar22 + m;
            pdVar26 = pdVar26 + m;
            pdVar21 = pdVar21 + iVar15;
          } while (iVar16 < iVar34);
        }
      }
      uVar31 = uVar31 - 1;
      iVar23 = iVar23 + 1;
    } while (iVar23 != nseg);
  }
  return;
}

Assistant:

void
dpanel_bmod (
	    const int  m,          /* in - number of rows in the matrix */
	    const int  w,          /* in */
	    const int  jcol,       /* in */
	    const int  nseg,       /* in */
	    double     *dense,     /* out, of size n by w */
	    double     *tempv,     /* working array */
	    int        *segrep,    /* in */
	    int        *repfnz,    /* in, of size n by w */
	    GlobalLU_t *Glu,       /* modified */
	    SuperLUStat_t *stat    /* output */
	    )
{


#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int          incx = 1, incy = 1;
    double       alpha, beta;
#endif

    register int k, ksub;
    int          fsupc, nsupc, nsupr, nrow;
    int          krep, krep_ind;
    double       ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          segsze;
    int          block_nrow;  /* no of rows in a block row */
    int_t        lptr;	      /* Points to the row subscripts of a supernode */
    int          kfnz, irow, no_zeros; 
    register int isub, isub1, i;
    register int jj;	      /* Index through each column in the panel */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    double       *lusup;
    int_t        *xlusup;
    int          *repfnz_col; /* repfnz[] for a column in the panel */
    double       *dense_col;  /* dense[] for a column in the panel */
    double       *tempv1;             /* Used in 1-D update */
    double       *TriTmp, *MatvecTmp; /* used in 2-D update */
    double      zero = 0.0;
    double      one = 1.0;
    register int ldaTmp;
    register int r_ind, r_hi;
    int  maxsuper, rowblk, colblk;
    flops_t  *ops = stat->ops;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (double *) Glu->lusup;
    xlusup  = Glu->xlusup;
    
    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) );
    rowblk   = sp_ienv(4);
    colblk   = sp_ienv(5);
    ldaTmp   = maxsuper + rowblk;

    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) { /* for each updating supernode */

	/* krep = representative of current k-th supernode
	 * fsupc = first supernodal column
	 * nsupc = no of columns in a supernode
	 * nsupr = no of rows in a supernode
	 */
        krep = segrep[k--];
	fsupc = xsup[supno[krep]];
	nsupc = krep - fsupc + 1;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nrow = nsupr - nsupc;
	lptr = xlsub[fsupc];
	krep_ind = lptr + nsupc - 1;

	repfnz_col = repfnz;
	dense_col = dense;
	
	if ( nsupc >= colblk && nrow > rowblk ) { /* 2-D block update */

	    TriTmp = tempv;
	
	    /* Sequence through each column in panel -- triangular solves */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp ) {

		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
	    
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += segsze * (segsze - 1);
		ops[GEMV] += 2 * nrow * segsze;
	
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
			dense_col[irow] -= ukj * lusup[luptr];
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
			ukj -= ukj1 * lusup[luptr1];
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++;
			    dense_col[irow] -= (ukj*lusup[luptr]
						+ ukj1*lusup[luptr1]);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
			ukj1 -= ukj2 * lusup[luptr2-1];
			ukj = ukj - ukj1*lusup[luptr1] - ukj2*lusup[luptr2];
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++; luptr2++;
			    dense_col[irow] -= ( ukj*lusup[luptr]
                             + ukj1*lusup[luptr1] + ukj2*lusup[luptr2] );
			}
		    }

		} else  {	/* segsze >= 4 */
		    
		    /* Copy U[*,j] segment from dense[*] to TriTmp[*], which
		       holds the result of triangular solves.    */
		    no_zeros = kfnz - fsupc;
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			TriTmp[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#else
		    dtrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#endif
#else		
		    dlsolve ( nsupr, segsze, &lusup[luptr], TriTmp );
#endif
		    

		} /* else ... */
	    
	    }  /* for jj ... end tri-solves */

	    /* Block row updates; push all the way into dense[*] block */
	    for ( r_ind = 0; r_ind < nrow; r_ind += rowblk ) {
		
		r_hi = SUPERLU_MIN(nrow, r_ind + rowblk);
		block_nrow = SUPERLU_MIN(rowblk, r_hi - r_ind);
		luptr = xlusup[fsupc] + nsupc + r_ind;
		isub1 = lptr + nsupc + r_ind;
		
		repfnz_col = repfnz;
		TriTmp = tempv;
		dense_col = dense;
		
		/* Sequence through each column in panel -- matrix-vector */
		for (jj = jcol; jj < jcol + w; jj++,
		     repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		    
		    kfnz = repfnz_col[krep];
		    if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		    
		    segsze = krep - kfnz + 1;
		    if ( segsze <= 3 ) continue;   /* skip unrolled cases */
		    
		    /* Perform a block update, and scatter the result of
		       matrix-vector to dense[].		 */
		    no_zeros = kfnz - fsupc;
		    luptr1 = luptr + nsupr * no_zeros;
		    MatvecTmp = &TriTmp[maxsuper];
		    
#ifdef USE_VENDOR_BLAS
		    alpha = one; 
                    beta = zero;
#ifdef _CRAY
		    SGEMV(ftcs2, &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#else
		    dgemv_("N", &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#endif
#else
		    dmatvec(nsupr, block_nrow, segsze, &lusup[luptr1],
			   TriTmp, MatvecTmp);
#endif
		    
		    /* Scatter MatvecTmp[*] into SPA dense[*] temporarily
		     * such that MatvecTmp[*] can be re-used for the
		     * the next blok row update. dense[] will be copied into 
		     * global store after the whole panel has been finished.
		     */
		    isub = isub1;
		    for (i = 0; i < block_nrow; i++) {
			irow = lsub[isub];
			dense_col[irow] -= MatvecTmp[i];
			MatvecTmp[i] = zero;
			++isub;
		    }
		    
		} /* for jj ... */
		
	    } /* for each block row ... */
	    
	    /* Scatter the triangular solves into SPA dense[*] */
	    repfnz_col = repfnz;
	    TriTmp = tempv;
	    dense_col = dense;
	    
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		if ( segsze <= 3 ) continue; /* skip unrolled cases */
		
		no_zeros = kfnz - fsupc;		
		isub = lptr + no_zeros;
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    dense_col[irow] = TriTmp[i];
		    TriTmp[i] = zero;
		    ++isub;
		}
		
	    } /* for jj ... */
	    
	} else { /* 1-D block modification */
	    
	    
	    /* Sequence through each column in the panel */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m) {
		
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += segsze * (segsze - 1);
		ops[GEMV] += 2 * nrow * segsze;
		
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
			dense_col[irow] -= ukj * lusup[luptr];
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
			ukj -= ukj1 * lusup[luptr1];
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr;  ++luptr1;
			    dense_col[irow] -= (ukj*lusup[luptr]
						+ ukj1*lusup[luptr1]);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
			ukj1 -= ukj2 * lusup[luptr2-1];
			ukj = ukj - ukj1*lusup[luptr1] - ukj2*lusup[luptr2];
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr; ++luptr1; ++luptr2;
			    dense_col[irow] -= ( ukj*lusup[luptr]
                             + ukj1*lusup[luptr1] + ukj2*lusup[luptr2] );
			}
		    }

		} else  { /* segsze >= 4 */
		    /* 
		     * Perform a triangular solve and block update,
		     * then scatter the result of sup-col update to dense[].
		     */
		    no_zeros = kfnz - fsupc;
		    
		    /* Copy U[*,j] segment from dense[*] to tempv[*]: 
		     *    The result of triangular solve is in tempv[*];
		     *    The result of matrix vector update is in dense_col[*]
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			tempv[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;
		    
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#else
		    dtrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#endif
		    
		    luptr += segsze;	/* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
                    alpha = one;
                    beta = zero;
#ifdef _CRAY
		    SGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		    dgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		    dlsolve ( nsupr, segsze, &lusup[luptr], tempv );
		    
		    luptr += segsze;        /* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
		    dmatvec (nsupr, nrow, segsze, &lusup[luptr], tempv, tempv1);
#endif
		    
		    /* Scatter tempv[*] into SPA dense[*] temporarily, such
		     * that tempv[*] can be used for the triangular solve of
		     * the next column of the panel. They will be copied into 
		     * ucol[*] after the whole panel has been finished.
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; i++) {
			irow = lsub[isub];
			dense_col[irow] = tempv[i];
			tempv[i] = zero;
			isub++;
		    }
		    
		    /* Scatter the update from tempv1[*] into SPA dense[*] */
		    /* Start dense rectangular L */
		    for (i = 0; i < nrow; i++) {
			irow = lsub[isub];
			dense_col[irow] -= tempv1[i];
			tempv1[i] = zero;
			++isub;	
		    }
		    
		} /* else segsze>=4 ... */
		
	    } /* for each column in the panel... */
	    
	} /* else 1-D update ... */

    } /* for each updating supernode ... */

}